

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Train.cpp
# Opt level: O0

void __thiscall Train::show(Train *this)

{
  ostream *poVar1;
  void *pvVar2;
  Train *this_local;
  
  poVar1 = std::operator<<((ostream *)&std::cout,"Name of start station is: ");
  poVar1 = std::operator<<(poVar1,(string *)&this->name_of_station);
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  poVar1 = std::operator<<((ostream *)&std::cout,"Name of end station is: ");
  poVar1 = std::operator<<(poVar1,(string *)&(this->name_of_station).name_end_station);
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  poVar1 = std::operator<<((ostream *)&std::cout,"Time in road: ");
  pvVar2 = (void *)std::ostream::operator<<(poVar1,this->time_in_road);
  std::ostream::operator<<(pvVar2,std::endl<char,std::char_traits<char>>);
  poVar1 = std::operator<<((ostream *)&std::cout,"Number of train is: ");
  pvVar2 = (void *)std::ostream::operator<<(poVar1,this->number_train);
  std::ostream::operator<<(pvVar2,std::endl<char,std::char_traits<char>>);
  poVar1 = std::operator<<((ostream *)&std::cout,"Number of carriages is: ");
  pvVar2 = (void *)std::ostream::operator<<(poVar1,this->count_of_carriages);
  std::ostream::operator<<(pvVar2,std::endl<char,std::char_traits<char>>);
  return;
}

Assistant:

void Train::show() const{
    std::cout << "Name of start station is: " <<  name_of_station.name_start_station << std::endl;
    std::cout << "Name of end station is: " <<  name_of_station.name_end_station << std::endl;
    std::cout << "Time in road: " << time_in_road << std::endl;
    std::cout << "Number of train is: " << number_train << std::endl;
    std::cout << "Number of carriages is: " << count_of_carriages << std::endl;
}